

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O0

int get_simple_motion_search_prune_agg(int qindex,int prune_level,int is_rect_part)

{
  uint local_38;
  int sms_prune_agg_qindex_based [2];
  int qband;
  int sms_prune_agg_levels [4];
  int is_rect_part_local;
  int prune_level_local;
  int qindex_local;
  int local_4;
  
  if (prune_level == -1) {
    local_4 = -1;
  }
  else {
    sms_prune_agg_levels[0] = 0;
    sms_prune_agg_levels[1] = 1;
    sms_prune_agg_levels[2] = 2;
    sms_prune_agg_levels[3] = 3;
    if (prune_level < 4) {
      local_4 = sms_prune_agg_levels[prune_level];
    }
    else {
      if (is_rect_part == 0) {
        local_38 = 0;
      }
      else {
        local_38 = (uint)(qindex < 0x5b);
      }
      sms_prune_agg_qindex_based[0] = 1;
      sms_prune_agg_qindex_based[1] = 2;
      local_4 = sms_prune_agg_qindex_based[(int)local_38];
    }
  }
  return local_4;
}

Assistant:

static inline int get_simple_motion_search_prune_agg(int qindex,
                                                     int prune_level,
                                                     int is_rect_part) {
  assert(prune_level < TOTAL_AGG_LVLS);
  if (prune_level == NO_PRUNING) {
    return -1;
  }

  // Aggressiveness value for SIMPLE_MOTION_SEARCH_PRUNE_LEVEL except
  // QIDX_BASED_AGG_LVL
  const int sms_prune_agg_levels[TOTAL_SIMPLE_AGG_LVLS] = { 0, 1, 2, 3 };
  if (prune_level < TOTAL_SIMPLE_AGG_LVLS) {
    return sms_prune_agg_levels[prune_level];
  }

  // Map the QIDX_BASED_AGG_LVL to corresponding aggressiveness value.
  // Aggressive pruning for lower quantizers in non-boosted frames to prune
  // rectangular partitions.
  const int qband = is_rect_part ? (qindex <= 90 ? 1 : 0) : 0;
  const int sms_prune_agg_qindex_based[2] = { 1, 2 };
  return sms_prune_agg_qindex_based[qband];
}